

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void beginExpansion(char *str,bool owned,char *name)

{
  size_t sVar1;
  Expansion *pEVar2;
  int *piVar3;
  char *pcVar4;
  char *local_38;
  Expansion *exp;
  size_t size;
  char *name_local;
  bool owned_local;
  char *str_local;
  
  sVar1 = strlen(str);
  if (sVar1 != 0) {
    if (name != (char *)0x0) {
      lexer_CheckRecursionDepth();
    }
    pEVar2 = (Expansion *)malloc(0x30);
    if (pEVar2 == (Expansion *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fatalerror("Unable to allocate new expansion: %s\n",pcVar4);
    }
    pEVar2->parent = lexerState->expansions;
    if (name == (char *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = strdup(name);
    }
    pEVar2->name = local_38;
    (pEVar2->contents).unowned = str;
    pEVar2->size = sVar1;
    pEVar2->offset = 0;
    pEVar2->owned = owned;
    lexerState->expansions = pEVar2;
  }
  return;
}

Assistant:

static void beginExpansion(char const *str, bool owned, char const *name)
{
	size_t size = strlen(str);

	// Do not expand empty strings
	if (!size)
		return;

	if (name)
		lexer_CheckRecursionDepth();

	struct Expansion *exp = (struct Expansion *)malloc(sizeof(*exp));

	if (!exp)
		fatalerror("Unable to allocate new expansion: %s\n", strerror(errno));

	exp->parent = lexerState->expansions;
	exp->name = name ? strdup(name) : NULL;
	exp->contents.unowned = str;
	exp->size = size;
	exp->offset = 0;
	exp->owned = owned;

	lexerState->expansions = exp;
}